

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O2

void __thiscall Js::GlobalObject::Initialize(GlobalObject *this,ScriptContext *scriptContext)

{
  Recycler *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *alloc;
  JavascriptLibrary *this_01;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  if ((((this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.type.ptr)->
      javascriptLibrary).ptr != (JavascriptLibrary *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x2f,"(type->javascriptLibrary == nullptr)",
                                "type->javascriptLibrary == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this_00 = scriptContext->recycler;
  local_50 = (undefined1  [8])&JavascriptLibrary::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_64c0234;
  data.filename._0_4_ = 0x31;
  alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_50);
  this_01 = (JavascriptLibrary *)new<Memory::Recycler>(0x1de0,alloc,0x391482);
  JavascriptLibrary::JavascriptLibrary(this_01,this,this_00);
  (scriptContext->super_ScriptContextBase).javascriptLibrary = this_01;
  Memory::WriteBarrierPtr<Js::JavascriptLibrary>::WriteBarrierSet
            (&((this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.type.ptr)->
              javascriptLibrary,this_01);
  ScriptContext::InitializeCache(scriptContext);
  JavascriptLibrary::Initialize(this_01,scriptContext,this);
  Memory::WriteBarrierPtr<Js::JavascriptLibrary>::WriteBarrierSet(&this->library,this_01);
  return;
}

Assistant:

void GlobalObject::Initialize(ScriptContext * scriptContext)
    {
        Assert(type->javascriptLibrary == nullptr);
        Recycler * recycler = scriptContext->GetRecycler();
        JavascriptLibrary* localLibrary = RecyclerNewFinalized(recycler, JavascriptLibrary, this, recycler);
        scriptContext->SetLibrary(localLibrary);
        type->javascriptLibrary = localLibrary;
        scriptContext->InitializeCache();
        localLibrary->Initialize(scriptContext, this);
        library = localLibrary;
    }